

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

bool __thiscall ONX_Model::Read(ONX_Model *this,char *filename,ON_TextLog *error_log)

{
  bool bVar1;
  FILE *fp;
  ON_TextLog *in_R8;
  ON_BinaryFile file;
  ON_BinaryFile OStack_248;
  
  if ((filename != (char *)0x0) && (fp = ON::OpenFile(filename,"rb"), fp != (FILE *)0x0)) {
    ON_BinaryFile::ON_BinaryFile(&OStack_248,read3dm,fp);
    bVar1 = Read(this,&OStack_248.super_ON_BinaryArchive,0,0,in_R8);
    ON::CloseFile(fp);
    ON_BinaryFile::~ON_BinaryFile(&OStack_248);
    return bVar1;
  }
  return false;
}

Assistant:

bool ONX_Model::Read(const char* filename, ON_TextLog* error_log)
{
  bool rc = false;

  if (nullptr != filename)
  {
    FILE* fp = ON::OpenFile(filename, "rb");
    if ( 0 != fp )
    {
      ON_BinaryFile file(ON::archive_mode::read3dm,fp);
      rc = Read(file, error_log);
      ON::CloseFile(fp);
    }
  }

  return rc;
}